

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KokkosProfilingSymbols.cpp
# Opt level: O1

void kokkosp_parse_args(int argc,char **argv_raw)

{
  bool bVar1;
  ostream *poVar2;
  string local_38;
  
  if (2 < argc) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: the Kokkos Caliper connector takes only one argument",
               0x3b);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
  }
  if (argc == 2) {
    cali::ConfigManager::add((ConfigManager *)kokkos::mgr,argv_raw[1]);
    bVar1 = cali::ConfigManager::error((ConfigManager *)kokkos::mgr);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Kokkos Caliper connector error: ",0x20);
      cali::ConfigManager::error_msg_abi_cxx11_(&local_38,(ConfigManager *)kokkos::mgr);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_38._M_dataplus._M_p,local_38._M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
    cali::ConfigManager::start((ConfigManager *)kokkos::mgr);
  }
  return;
}

Assistant:

void kokkosp_parse_args(int argc, char* argv_raw[])
{
    if (argc > 2) {
        std::cerr << "Error: the Kokkos Caliper connector takes only one argument" << std::endl;
    }
    if (argc == 2) {
        kokkos::mgr.add(argv_raw[1]);
        if (kokkos::mgr.error()) {
            std::cerr << "Kokkos Caliper connector error: " << kokkos::mgr.error_msg() << std::endl;
        }
        kokkos::mgr.start();
    }
}